

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderSAHQuantized<4,_embree::QuadMi<4>_>::build
          (BVHNBuilderSAHQuantized<4,_embree::QuadMi<4>_> *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer ppTVar4;
  PrimRef *pPVar5;
  MemoryMonitorInterface *pMVar6;
  Scene *pSVar7;
  GTypeMask GVar8;
  double t0;
  double dVar9;
  undefined8 uVar10;
  bool bVar11;
  long lVar12;
  Geometry *pGVar13;
  PrimRef *pPVar14;
  size_t sVar15;
  NodeRef root;
  uint uVar16;
  size_t i;
  ulong uVar17;
  pointer ppTVar18;
  BVH **ppBVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  BVH *pBVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  PrimInfo pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  pGVar13 = this->mesh;
  if (pGVar13 == (Geometry *)0x0) {
LAB_00474368:
    pSVar7 = this->scene;
    GVar8 = this->gtype_;
    uVar16 = (uint)GVar8;
    if ((uVar16 >> 0x14 & 1) == 0) {
      sVar15 = 0;
    }
    else {
      sVar15 = (pSVar7->world).numTriangles;
    }
    if ((uVar16 >> 0x15 & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numQuads;
    }
    if ((GVar8 & MTY_CURVE2) != ~MTY_ALL) {
      sVar15 = sVar15 + (pSVar7->world).numLineSegments;
    }
    if ((GVar8 & MTY_CURVE4) != ~MTY_ALL) {
      sVar15 = sVar15 + (pSVar7->world).numBezierCurves;
    }
    if ((GVar8 & MTY_POINTS) != ~MTY_ALL) {
      sVar15 = sVar15 + (pSVar7->world).numPoints;
    }
    if ((uVar16 >> 0x17 & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numSubdivPatches;
    }
    if ((uVar16 >> 0x1d & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numUserGeometries;
    }
    if ((uVar16 >> 0x1e & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numInstancesCheap;
    }
    if ((int)uVar16 < 0) {
      sVar15 = sVar15 + (pSVar7->world).numInstancesExpensive;
    }
    if ((uVar16 >> 0x18 & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numInstanceArrays;
    }
    if ((uVar16 >> 0x16 & 1) != 0) {
      sVar15 = sVar15 + (pSVar7->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar15;
    if (sVar15 == 0) goto LAB_004744f0;
    pBVar23 = this->bvh;
    std::__cxx11::to_string(&local_e8,4);
    std::operator+(&local_108,"sse2::QBVH",&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_108,"BuilderSAH");
    bVar11 = true;
  }
  else {
    if (pGVar13->numPrimitives != this->numPreviousPrimitives) {
      pBVar23 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar23->alloc);
      ppTVar4 = (pBVar23->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar18 = (pBVar23->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppTVar18 != ppTVar4;
          ppTVar18 = ppTVar18 + 1) {
        FastAllocator::ThreadLocal2::unbind(*ppTVar18,&pBVar23->alloc);
      }
      ppTVar18 = (pBVar23->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar23->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar18) {
        (pBVar23->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar18;
      }
      LOCK();
      (pBVar23->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar23->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar23->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar23->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar23->alloc).usedBlocks._M_b._M_p,(pBVar23->alloc).device,
                   (pBVar23->alloc).useUSM);
      }
      LOCK();
      (pBVar23->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar23->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar23->alloc).freeBlocks._M_b._M_p,(pBVar23->alloc).device,
                   (pBVar23->alloc).useUSM);
      }
      LOCK();
      (pBVar23->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      for (lVar12 = -0x40; lVar12 != 0; lVar12 = lVar12 + 8) {
        LOCK();
        *(undefined8 *)((long)&(pBVar23->alloc).threadBlocks[0]._M_b._M_p + lVar12) = 0;
        UNLOCK();
        LOCK();
        *(undefined8 *)((long)&(pBVar23->alloc).threadBlocks[8]._M_b._M_p + lVar12) = 0;
        UNLOCK();
      }
      sVar15 = (pBVar23->alloc).primrefarray.size_alloced;
      pPVar5 = (pBVar23->alloc).primrefarray.items;
      if (pPVar5 != (PrimRef *)0x0) {
        if (sVar15 << 5 < 0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,sVar15 << 5,(pBVar23->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar15 != 0) {
        pMVar6 = (pBVar23->alloc).primrefarray.alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar15 * -0x20,1);
      }
      (pBVar23->alloc).primrefarray.items = (PrimRef *)0x0;
      (pBVar23->alloc).primrefarray.size_active = 0;
      (pBVar23->alloc).primrefarray.size_alloced = 0;
      pGVar13 = this->mesh;
      if (pGVar13 == (Geometry *)0x0) goto LAB_00474368;
    }
    sVar15 = (size_t)pGVar13->numPrimitives;
    this->numPreviousPrimitives = pGVar13->numPrimitives;
    if (sVar15 == 0) {
LAB_004744f0:
      sVar15 = (this->prims).size_alloced;
      pPVar5 = (this->prims).items;
      if (pPVar5 != (PrimRef *)0x0) {
        if (sVar15 << 5 < 0x1c00000) {
          alignedFree(pPVar5);
        }
        else {
          os_free(pPVar5,sVar15 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar15 != 0) {
        pMVar6 = (this->prims).alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar15 * -0x20,1);
      }
      (this->prims).items = (PrimRef *)0x0;
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    pBVar23 = this->bvh;
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_108);
    bVar11 = false;
  }
  ppBVar19 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar23,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (bVar11) {
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  uVar17 = (this->prims).size_alloced;
  uVar22 = uVar17;
  if ((uVar17 < sVar15) && (uVar21 = uVar17, uVar22 = sVar15, uVar17 != 0)) {
    for (; uVar22 = uVar21, uVar21 < sVar15; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  psVar1 = &(this->prims).size_active;
  if (sVar15 < (this->prims).size_active) {
    *psVar1 = sVar15;
  }
  prims = &this->prims;
  if (uVar17 == uVar22) {
    *psVar1 = sVar15;
  }
  else {
    pMVar6 = (this->prims).alloc.device;
    pPVar5 = (this->prims).items;
    uVar17 = uVar22 << 5;
    (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar17,0);
    if (uVar17 < 0x1c00000) {
      pPVar14 = (PrimRef *)alignedMalloc(uVar17,0x20);
    }
    else {
      pPVar14 = (PrimRef *)os_malloc(uVar17,&(this->prims).alloc.hugepages);
    }
    (this->prims).items = pPVar14;
    lVar12 = 0x10;
    for (uVar17 = 0; uVar17 < *psVar1; uVar17 = uVar17 + 1) {
      pPVar14 = (this->prims).items;
      puVar2 = (undefined8 *)((long)pPVar5 + lVar12 + -0x10);
      uVar10 = puVar2[1];
      puVar3 = (undefined8 *)((long)pPVar14 + lVar12 + -0x10);
      *puVar3 = *puVar2;
      puVar3[1] = uVar10;
      puVar2 = (undefined8 *)((long)&(pPVar5->lower).field_0 + lVar12);
      uVar10 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pPVar14->lower).field_0 + lVar12);
      *puVar3 = *puVar2;
      puVar3[1] = uVar10;
      lVar12 = lVar12 + 0x20;
    }
    sVar20 = (this->prims).size_alloced;
    if (pPVar5 != (PrimRef *)0x0) {
      if (sVar20 << 5 < 0x1c00000) {
        alignedFree(pPVar5);
      }
      else {
        os_free(pPVar5,sVar20 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar20 != 0) {
      pMVar6 = (prims->alloc).device;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar20 * -0x20,1);
    }
    (this->prims).size_active = sVar15;
    (this->prims).size_alloced = uVar22;
  }
  if (this->mesh == (Geometry *)0x0) {
    sse2::createPrimRefArray
              (&pinfo,this->scene,this->gtype_,false,sVar15,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    sse2::createPrimRefArray
              (&pinfo,this->mesh,this->geomID_,sVar15,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar19)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar9 = (double)(sVar15 + 3 >> 2) * 1.2 * 96.0;
  uVar17 = (ulong)dVar9;
  sVar20 = ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17) +
           (sVar15 * 0x50 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar20);
  sVar15 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar15,sVar20);
  (this->settings).singleThreadThreshold = sVar15;
  local_78._8_8_ = this->bvh;
  local_78._0_8_ = &PTR_createLeaf_021dc370;
  root = BVHNBuilderQuantizedVirtual<4>::BVHNBuilderV::build
                   ((BVHNBuilderV *)&local_78.field_1,&((BVH *)local_78._8_8_)->alloc,
                    &(((BVH *)local_78._8_8_)->scene->progressInterface).super_BuildProgressMonitor,
                    (this->prims).items,&pinfo,this->settings);
  local_78._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_78._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_68._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_68._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  local_58._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_58._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_48._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_48._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,pinfo.end - pinfo.begin);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar15 = (this->prims).size_alloced;
    pPVar5 = (this->prims).items;
    if (pPVar5 != (PrimRef *)0x0) {
      root.ptr = sVar15 << 5;
      if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar5);
      }
      else {
        os_free(pPVar5,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar15 != 0) {
      pMVar6 = (prims->alloc).device;
      root.ptr = sVar15 * -0x20;
      (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,root.ptr,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  BVHN<4>::cleanup(*ppBVar19,(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(*ppBVar19,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          prims.clear();
          bvh->clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::QBVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif
            /* create primref array */
            prims.resize(numPrimitives);
            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* call BVH builder */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::QuantizedNode)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            NodeRef root = BVHNBuilderQuantizedVirtual<N>::build(&bvh->alloc,CreateLeafQuantized<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            //bvh->layoutLargeNodes(pinfo.size()*0.005f); // FIXME: COPY LAYOUT FOR LARGE NODES !!!
#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }